

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O0

void __thiscall
LinkParser::parseEnergy
          (LinkParser *this,Link *link,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  InputError *pIVar5;
  reference pvVar6;
  Pattern *pPVar7;
  Curve *pCVar8;
  string local_1a0 [39];
  undefined1 local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  undefined1 local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  undefined1 local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [8];
  string keyword;
  string *tokens;
  allocator local_51;
  string local_50 [32];
  Network *local_30;
  Pump *pump;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  Link *link_local;
  LinkParser *this_local;
  
  pump = (Pump *)tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)network;
  network_local = (Network *)link;
  link_local = (Link *)this;
  iVar3 = (*(link->super_Element)._vptr_Element[2])();
  if (iVar3 == 1) {
    local_30 = network_local;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pump);
    if (sVar4 < 4) {
      pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"",&local_51);
      InputError::InputError(pIVar5,2,(string *)local_50);
      __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pump,0);
    std::__cxx11::string::string(local_90,(string *)(pvVar6 + 0x40));
    pcVar1 = w_Price;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    bVar2 = Utilities::match((string *)local_90,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    pcVar1 = w_Pattern;
    if (bVar2) {
      bVar2 = Utilities::parseNumber<double>(pvVar6 + 0x60,(double *)&(local_30->units).field_0x80);
      if (!bVar2) {
        local_d9 = 1;
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_d8,(string *)(pvVar6 + 0x60));
        InputError::InputError(pIVar5,6,(string *)local_d8);
        local_d9 = 0;
        __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,pcVar1,&local_101);
      bVar2 = Utilities::match((string *)local_90,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      pcVar1 = w_Effic;
      if (bVar2) {
        pPVar7 = Network::pattern((Network *)tokenList_local,pvVar6 + 0x60);
        *(Pattern **)&(local_30->units).field_0x78 = pPVar7;
        if (*(long *)&(local_30->units).field_0x78 == 0) {
          local_129 = 1;
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_128,(string *)(pvVar6 + 0x60));
          InputError::InputError(pIVar5,5,(string *)local_128);
          local_129 = 0;
          __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,pcVar1,&local_151);
        bVar2 = Utilities::match((string *)local_90,(string *)local_150);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        if (!bVar2) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_1a0,local_90);
          InputError::InputError(pIVar5,3,(string *)local_1a0);
          __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
        }
        pCVar8 = Network::curve((Network *)tokenList_local,pvVar6 + 0x60);
        *(Curve **)&(local_30->units).field_0x70 = pCVar8;
        if (*(long *)&(local_30->units).field_0x70 == 0) {
          local_179 = 1;
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_178,(string *)(pvVar6 + 0x60));
          InputError::InputError(pIVar5,5,(string *)local_178);
          local_179 = 0;
          __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
        }
      }
    }
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

void LinkParser::parseEnergy(
        Link* link, Network* network, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - PUMP keyword
    // 1 - pump ID
    // 2 - PRICE/PATTERN/EFFIC keyword
    // 3 - price value or ID of pattern or efficiency curve

    // ... cast link to a pump

    if ( link->type() != Link::PUMP ) return;
    Pump* pump = static_cast<Pump*>(link);

    // ... read keyword from input stream

    if ( tokenList.size() < 4) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];
    string keyword = tokens[2];

    // ... read energy cost per Kwh

    if ( Utilities::match(keyword, w_Price) )
    {
        if ( !Utilities::parseNumber(tokens[3], pump->costPerKwh) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[3]);
        }
    }

    // ... read name of energy cost time pattern

    else if ( Utilities::match(keyword, w_Pattern) )
    {
        pump->costPattern = network->pattern(tokens[3]);
        if ( !pump->costPattern )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    // ... read name of pump efficiency curve

    else if ( Utilities::match(keyword, w_Effic) )
    {
        pump->efficCurve = network->curve(tokens[3]);
        if ( !pump->efficCurve )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    else throw InputError(InputError::INVALID_KEYWORD, keyword);
}